

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsTypes.cpp
# Opt level: O0

RegisterSpace * Js::AllocateRegisterSpace(ArenaAllocator *alloc,Types type)

{
  code *pcVar1;
  bool bVar2;
  AsmJsRegisterSpace<int> *this;
  AsmJsRegisterSpace<float> *this_00;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar3;
  AsmJsRegisterSpace<double> *this_01;
  AsmJsRegisterSpace<long> *this_02;
  undefined4 *puVar4;
  TrackAllocData local_f0;
  code *local_c8;
  undefined8 local_c0;
  TrackAllocData local_b8;
  code *local_90;
  undefined8 local_88;
  TrackAllocData local_80;
  code *local_58;
  undefined8 local_50;
  TrackAllocData local_48;
  Types local_1c;
  ArenaAllocator *pAStack_18;
  Types type_local;
  ArenaAllocator *alloc_local;
  
  local_1c = type;
  pAStack_18 = alloc;
  switch(type) {
  case INT32:
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_48,(type_info *)&AsmJsRegisterSpace<int>::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsTypes.cpp"
               ,0x2bd);
    pAVar3 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(&alloc->
                             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                            ,&local_48);
    local_58 = Memory::ArenaAllocator::Alloc;
    local_50 = 0;
    this = (AsmJsRegisterSpace<int> *)
           new<Memory::ArenaAllocator>(0x50,(ArenaAllocator *)pAVar3,0x3f67b0);
    AsmJsRegisterSpace<int>::AsmJsRegisterSpace(this,pAStack_18);
    alloc_local = (ArenaAllocator *)this;
    break;
  case INT64:
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_f0,(type_info *)&AsmJsRegisterSpace<long>::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsTypes.cpp"
               ,0x2c1);
    pAVar3 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(&alloc->
                             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                            ,&local_f0);
    this_02 = (AsmJsRegisterSpace<long> *)
              new<Memory::ArenaAllocator>(0x50,(ArenaAllocator *)pAVar3,0x3f67b0);
    AsmJsRegisterSpace<long>::AsmJsRegisterSpace(this_02,pAStack_18);
    alloc_local = (ArenaAllocator *)this_02;
    break;
  case FLOAT32:
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_80,(type_info *)&AsmJsRegisterSpace<float>::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsTypes.cpp"
               ,0x2be);
    pAVar3 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(&alloc->
                             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                            ,&local_80);
    local_90 = Memory::ArenaAllocator::Alloc;
    local_88 = 0;
    this_00 = (AsmJsRegisterSpace<float> *)
              new<Memory::ArenaAllocator>(0x50,(ArenaAllocator *)pAVar3,0x3f67b0);
    AsmJsRegisterSpace<float>::AsmJsRegisterSpace(this_00,pAStack_18);
    alloc_local = (ArenaAllocator *)this_00;
    break;
  case FLOAT64:
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_b8,(type_info *)&AsmJsRegisterSpace<double>::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsTypes.cpp"
               ,0x2bf);
    pAVar3 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(&alloc->
                             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                            ,&local_b8);
    local_c8 = Memory::ArenaAllocator::Alloc;
    local_c0 = 0;
    this_01 = (AsmJsRegisterSpace<double> *)
              new<Memory::ArenaAllocator>(0x50,(ArenaAllocator *)pAVar3,0x3f67b0);
    AsmJsRegisterSpace<double>::AsmJsRegisterSpace(this_01,pAStack_18);
    alloc_local = (ArenaAllocator *)this_01;
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsTypes.cpp"
                                ,0x2c4,"(false)","Invalid native asm.js type");
    if (bVar2) {
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
      Throw::InternalError();
    }
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  return (RegisterSpace *)alloc_local;
}

Assistant:

WAsmJs::RegisterSpace*
        AllocateRegisterSpace(ArenaAllocator* alloc, WAsmJs::Types type)
    {
        switch(type)
        {
        case WAsmJs::INT32: return Anew(alloc, AsmJsRegisterSpace<int>, alloc);
        case WAsmJs::FLOAT32: return Anew(alloc, AsmJsRegisterSpace<float>, alloc);
        case WAsmJs::FLOAT64: return Anew(alloc, AsmJsRegisterSpace<double>, alloc);
#if TARGET_64
        case WAsmJs::INT64: return Anew(alloc, AsmJsRegisterSpace<int64>, alloc);
#endif
        default:
            AssertMsg(false, "Invalid native asm.js type");
            Js::Throw::InternalError();
        }
    }